

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O3

void __thiscall BoardView::ContextMenu(BoardView *this)

{
  pointer pAVar1;
  pointer pAVar2;
  long *plVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  bool bVar35;
  int iVar36;
  int iVar37;
  ulong uVar38;
  ulong uVar39;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar40;
  byte bVar41;
  bool *pbVar42;
  long lVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  long lVar46;
  shared_ptr<Pin> *pin_1;
  long *plVar47;
  undefined4 uVar48;
  float fVar49;
  float fVar50;
  ImVec2 IVar51;
  undefined4 uVar53;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar52 [16];
  float fVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  int iVar77;
  undefined1 auVar75 [16];
  int iVar78;
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  int iVar92;
  int iVar96;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  bool dummy;
  array<ImVec2,_4UL> poly;
  undefined8 in_stack_fffffffffffffec8;
  undefined8 uVar97;
  bool local_12d;
  float local_12c;
  undefined8 local_128;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined8 local_118;
  float fStack_110;
  float fStack_10c;
  float local_100;
  float local_fc;
  undefined1 local_f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  undefined1 local_d8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_c0;
  _Alloc_hider local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60 [2];
  ImVec2 local_38;
  
  local_12d = true;
  if (ContextMenu()::pin_abi_cxx11_ == '\0') {
    ContextMenu();
  }
  if (ContextMenu()::partn_abi_cxx11_ == '\0') {
    ContextMenu();
  }
  if (ContextMenu()::net_abi_cxx11_ == '\0') {
    ContextMenu();
  }
  auVar64 = ZEXT416(0x3f800000);
  IVar51 = ScreenToCoord(this,(this->m_showContextMenuPos).x,(this->m_showContextMenuPos).y,1.0);
  local_128._0_4_ = IVar51.x;
  local_128._4_4_ = IVar51.y;
  uStack_120 = (undefined4)extraout_XMM0_Qb;
  uStack_11c = (undefined4)((ulong)extraout_XMM0_Qb >> 0x20);
  local_fc = truncf((float)local_128);
  local_118._0_4_ = local_128._4_4_;
  local_118._4_4_ = local_128._4_4_;
  fStack_110 = local_128._4_4_;
  fStack_10c = local_128._4_4_;
  local_100 = truncf(local_128._4_4_);
  local_12c = DPIF(50.0);
  local_d8._4_4_ = DPIF(50.0);
  auVar55 = ZEXT416((uint)local_12c);
  local_d8._0_4_ = local_12c;
  local_f8._0_4_ = 0.0;
  local_f8._4_4_ = 0.0;
  ImGui::SetNextWindowPos((ImVec2 *)local_d8,0,(ImVec2 *)local_f8);
  ImGui::PushStyleVar(4,1.0);
  bVar35 = ImGui::BeginPopupModal("Annotations",&local_12d,0x40);
  if (!bVar35) goto LAB_0011559f;
  if (this->m_showContextMenu == true) {
    ContextMenu::contextbuf[0] = '\0';
    this->m_showContextMenu = false;
    auVar34 = _DAT_001e96a0;
    auVar33 = _DAT_001e9690;
    auVar32 = _DAT_001e9680;
    auVar31 = _DAT_001e9670;
    auVar30 = _DAT_001e9660;
    auVar29 = _DAT_001e9650;
    auVar28 = _DAT_001e93b0;
    pAVar1 = (this->m_annotations).annotations.
             super__Vector_base<Annotation,_std::allocator<Annotation>_>._M_impl.
             super__Vector_impl_data._M_start;
    pAVar2 = (this->m_annotations).annotations.
             super__Vector_base<Annotation,_std::allocator<Annotation>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pAVar1 != pAVar2) {
      uVar38 = (long)pAVar2 + (-0xa0 - (long)pAVar1);
      auVar75._8_8_ = 0;
      auVar75._0_8_ = uVar38;
      uVar48 = SUB164(auVar75 * ZEXT816(0xcccccccccccccccd),8);
      uVar53 = (undefined4)(uVar38 / 0x140000000);
      auVar79._0_8_ = CONCAT44(uVar53,uVar48);
      auVar79._8_4_ = uVar48;
      auVar79._12_4_ = uVar53;
      auVar52._0_8_ = auVar79._0_8_ >> 7;
      auVar52._8_8_ = auVar79._8_8_ >> 7;
      pbVar42 = &pAVar1[0xf].hovered;
      uVar39 = 0;
      do {
        auVar73._8_4_ = (int)uVar39;
        auVar73._0_8_ = uVar39;
        auVar73._12_4_ = (int)(uVar39 >> 0x20);
        auVar75 = auVar52 ^ auVar28;
        auVar79 = (auVar73 | auVar34) ^ auVar28;
        iVar37 = auVar75._0_4_;
        iVar92 = -(uint)(iVar37 < auVar79._0_4_);
        iVar36 = auVar75._4_4_;
        auVar81._4_4_ = -(uint)(iVar36 < auVar79._4_4_);
        iVar77 = auVar75._8_4_;
        iVar96 = -(uint)(iVar77 < auVar79._8_4_);
        iVar78 = auVar75._12_4_;
        auVar81._12_4_ = -(uint)(iVar78 < auVar79._12_4_);
        auVar14._4_4_ = iVar92;
        auVar14._0_4_ = iVar92;
        auVar14._8_4_ = iVar96;
        auVar14._12_4_ = iVar96;
        auVar75 = pshuflw(auVar55,auVar14,0xe8);
        auVar80._4_4_ = -(uint)(auVar79._4_4_ == iVar36);
        auVar80._12_4_ = -(uint)(auVar79._12_4_ == iVar78);
        auVar80._0_4_ = auVar80._4_4_;
        auVar80._8_4_ = auVar80._12_4_;
        auVar79 = pshuflw(auVar64,auVar80,0xe8);
        auVar81._0_4_ = auVar81._4_4_;
        auVar81._8_4_ = auVar81._12_4_;
        auVar64 = pshuflw(auVar75,auVar81,0xe8);
        auVar55._8_4_ = 0xffffffff;
        auVar55._0_8_ = 0xffffffffffffffff;
        auVar55._12_4_ = 0xffffffff;
        auVar55 = (auVar64 | auVar79 & auVar75) ^ auVar55;
        auVar55 = packssdw(auVar55,auVar55);
        if ((auVar55 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pbVar42[-0x960] = false;
        }
        auVar15._4_4_ = iVar92;
        auVar15._0_4_ = iVar92;
        auVar15._8_4_ = iVar96;
        auVar15._12_4_ = iVar96;
        auVar81 = auVar80 & auVar15 | auVar81;
        auVar55 = packssdw(auVar81,auVar81);
        auVar64._8_4_ = 0xffffffff;
        auVar64._0_8_ = 0xffffffffffffffff;
        auVar64._12_4_ = 0xffffffff;
        auVar55 = packssdw(auVar55 ^ auVar64,auVar55 ^ auVar64);
        auVar55 = packsswb(auVar55,auVar55);
        if ((auVar55._0_4_ >> 8 & 1) != 0) {
          pbVar42[-0x8c0] = false;
        }
        auVar55 = (auVar73 | auVar33) ^ auVar28;
        auVar65._0_4_ = -(uint)(iVar37 < auVar55._0_4_);
        auVar65._4_4_ = -(uint)(iVar36 < auVar55._4_4_);
        auVar65._8_4_ = -(uint)(iVar77 < auVar55._8_4_);
        auVar65._12_4_ = -(uint)(iVar78 < auVar55._12_4_);
        auVar82._4_4_ = auVar65._0_4_;
        auVar82._0_4_ = auVar65._0_4_;
        auVar82._8_4_ = auVar65._8_4_;
        auVar82._12_4_ = auVar65._8_4_;
        iVar92 = -(uint)(auVar55._4_4_ == iVar36);
        iVar96 = -(uint)(auVar55._12_4_ == iVar78);
        auVar16._4_4_ = iVar92;
        auVar16._0_4_ = iVar92;
        auVar16._8_4_ = iVar96;
        auVar16._12_4_ = iVar96;
        auVar93._4_4_ = auVar65._4_4_;
        auVar93._0_4_ = auVar65._4_4_;
        auVar93._8_4_ = auVar65._12_4_;
        auVar93._12_4_ = auVar65._12_4_;
        auVar55 = auVar16 & auVar82 | auVar93;
        auVar55 = packssdw(auVar55,auVar55);
        auVar5._8_4_ = 0xffffffff;
        auVar5._0_8_ = 0xffffffffffffffff;
        auVar5._12_4_ = 0xffffffff;
        auVar55 = packssdw(auVar55 ^ auVar5,auVar55 ^ auVar5);
        auVar55 = packsswb(auVar55,auVar55);
        if ((auVar55._0_4_ >> 0x10 & 1) != 0) {
          pbVar42[-0x820] = false;
        }
        auVar55 = pshufhw(auVar55,auVar82,0x84);
        auVar17._4_4_ = iVar92;
        auVar17._0_4_ = iVar92;
        auVar17._8_4_ = iVar96;
        auVar17._12_4_ = iVar96;
        auVar75 = pshufhw(auVar65,auVar17,0x84);
        auVar64 = pshufhw(auVar55,auVar93,0x84);
        auVar56._8_4_ = 0xffffffff;
        auVar56._0_8_ = 0xffffffffffffffff;
        auVar56._12_4_ = 0xffffffff;
        auVar56 = (auVar64 | auVar75 & auVar55) ^ auVar56;
        auVar55 = packssdw(auVar56,auVar56);
        auVar55 = packsswb(auVar55,auVar55);
        if ((auVar55._0_4_ >> 0x18 & 1) != 0) {
          pbVar42[-0x780] = false;
        }
        auVar55 = (auVar73 | auVar32) ^ auVar28;
        auVar66._0_4_ = -(uint)(iVar37 < auVar55._0_4_);
        auVar66._4_4_ = -(uint)(iVar36 < auVar55._4_4_);
        auVar66._8_4_ = -(uint)(iVar77 < auVar55._8_4_);
        auVar66._12_4_ = -(uint)(iVar78 < auVar55._12_4_);
        auVar18._4_4_ = auVar66._0_4_;
        auVar18._0_4_ = auVar66._0_4_;
        auVar18._8_4_ = auVar66._8_4_;
        auVar18._12_4_ = auVar66._8_4_;
        auVar75 = pshuflw(auVar93,auVar18,0xe8);
        auVar57._0_4_ = -(uint)(auVar55._0_4_ == iVar37);
        auVar57._4_4_ = -(uint)(auVar55._4_4_ == iVar36);
        auVar57._8_4_ = -(uint)(auVar55._8_4_ == iVar77);
        auVar57._12_4_ = -(uint)(auVar55._12_4_ == iVar78);
        auVar83._4_4_ = auVar57._4_4_;
        auVar83._0_4_ = auVar57._4_4_;
        auVar83._8_4_ = auVar57._12_4_;
        auVar83._12_4_ = auVar57._12_4_;
        auVar55 = pshuflw(auVar57,auVar83,0xe8);
        auVar84._4_4_ = auVar66._4_4_;
        auVar84._0_4_ = auVar66._4_4_;
        auVar84._8_4_ = auVar66._12_4_;
        auVar84._12_4_ = auVar66._12_4_;
        auVar64 = pshuflw(auVar66,auVar84,0xe8);
        auVar6._8_4_ = 0xffffffff;
        auVar6._0_8_ = 0xffffffffffffffff;
        auVar6._12_4_ = 0xffffffff;
        auVar55 = packssdw(auVar55 & auVar75,(auVar64 | auVar55 & auVar75) ^ auVar6);
        auVar55 = packsswb(auVar55,auVar55);
        if ((auVar55 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          pbVar42[-0x6e0] = false;
        }
        auVar19._4_4_ = auVar66._0_4_;
        auVar19._0_4_ = auVar66._0_4_;
        auVar19._8_4_ = auVar66._8_4_;
        auVar19._12_4_ = auVar66._8_4_;
        auVar84 = auVar83 & auVar19 | auVar84;
        auVar64 = packssdw(auVar84,auVar84);
        auVar7._8_4_ = 0xffffffff;
        auVar7._0_8_ = 0xffffffffffffffff;
        auVar7._12_4_ = 0xffffffff;
        auVar55 = packssdw(auVar55,auVar64 ^ auVar7);
        auVar55 = packsswb(auVar55,auVar55);
        if ((auVar55._4_2_ >> 8 & 1) != 0) {
          pbVar42[-0x640] = false;
        }
        auVar55 = (auVar73 | auVar31) ^ auVar28;
        auVar67._0_4_ = -(uint)(iVar37 < auVar55._0_4_);
        auVar67._4_4_ = -(uint)(iVar36 < auVar55._4_4_);
        auVar67._8_4_ = -(uint)(iVar77 < auVar55._8_4_);
        auVar67._12_4_ = -(uint)(iVar78 < auVar55._12_4_);
        auVar85._4_4_ = auVar67._0_4_;
        auVar85._0_4_ = auVar67._0_4_;
        auVar85._8_4_ = auVar67._8_4_;
        auVar85._12_4_ = auVar67._8_4_;
        iVar92 = -(uint)(auVar55._4_4_ == iVar36);
        iVar96 = -(uint)(auVar55._12_4_ == iVar78);
        auVar20._4_4_ = iVar92;
        auVar20._0_4_ = iVar92;
        auVar20._8_4_ = iVar96;
        auVar20._12_4_ = iVar96;
        auVar94._4_4_ = auVar67._4_4_;
        auVar94._0_4_ = auVar67._4_4_;
        auVar94._8_4_ = auVar67._12_4_;
        auVar94._12_4_ = auVar67._12_4_;
        auVar55 = auVar20 & auVar85 | auVar94;
        auVar55 = packssdw(auVar55,auVar55);
        auVar8._8_4_ = 0xffffffff;
        auVar8._0_8_ = 0xffffffffffffffff;
        auVar8._12_4_ = 0xffffffff;
        auVar55 = packssdw(auVar55 ^ auVar8,auVar55 ^ auVar8);
        auVar55 = packsswb(auVar55,auVar55);
        if ((auVar55 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          pbVar42[-0x5a0] = false;
        }
        auVar55 = pshufhw(auVar55,auVar85,0x84);
        auVar21._4_4_ = iVar92;
        auVar21._0_4_ = iVar92;
        auVar21._8_4_ = iVar96;
        auVar21._12_4_ = iVar96;
        auVar75 = pshufhw(auVar67,auVar21,0x84);
        auVar64 = pshufhw(auVar55,auVar94,0x84);
        auVar58._8_4_ = 0xffffffff;
        auVar58._0_8_ = 0xffffffffffffffff;
        auVar58._12_4_ = 0xffffffff;
        auVar58 = (auVar64 | auVar75 & auVar55) ^ auVar58;
        auVar55 = packssdw(auVar58,auVar58);
        auVar55 = packsswb(auVar55,auVar55);
        if ((auVar55._6_2_ >> 8 & 1) != 0) {
          pbVar42[-0x500] = false;
        }
        auVar55 = (auVar73 | auVar30) ^ auVar28;
        auVar68._0_4_ = -(uint)(iVar37 < auVar55._0_4_);
        auVar68._4_4_ = -(uint)(iVar36 < auVar55._4_4_);
        auVar68._8_4_ = -(uint)(iVar77 < auVar55._8_4_);
        auVar68._12_4_ = -(uint)(iVar78 < auVar55._12_4_);
        auVar22._4_4_ = auVar68._0_4_;
        auVar22._0_4_ = auVar68._0_4_;
        auVar22._8_4_ = auVar68._8_4_;
        auVar22._12_4_ = auVar68._8_4_;
        auVar75 = pshuflw(auVar94,auVar22,0xe8);
        auVar59._0_4_ = -(uint)(auVar55._0_4_ == iVar37);
        auVar59._4_4_ = -(uint)(auVar55._4_4_ == iVar36);
        auVar59._8_4_ = -(uint)(auVar55._8_4_ == iVar77);
        auVar59._12_4_ = -(uint)(auVar55._12_4_ == iVar78);
        auVar86._4_4_ = auVar59._4_4_;
        auVar86._0_4_ = auVar59._4_4_;
        auVar86._8_4_ = auVar59._12_4_;
        auVar86._12_4_ = auVar59._12_4_;
        auVar55 = pshuflw(auVar59,auVar86,0xe8);
        auVar87._4_4_ = auVar68._4_4_;
        auVar87._0_4_ = auVar68._4_4_;
        auVar87._8_4_ = auVar68._12_4_;
        auVar87._12_4_ = auVar68._12_4_;
        auVar64 = pshuflw(auVar68,auVar87,0xe8);
        auVar69._8_4_ = 0xffffffff;
        auVar69._0_8_ = 0xffffffffffffffff;
        auVar69._12_4_ = 0xffffffff;
        auVar69 = (auVar64 | auVar55 & auVar75) ^ auVar69;
        auVar64 = packssdw(auVar69,auVar69);
        auVar55 = packsswb(auVar55 & auVar75,auVar64);
        if ((auVar55 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pbVar42[-0x460] = false;
        }
        auVar23._4_4_ = auVar68._0_4_;
        auVar23._0_4_ = auVar68._0_4_;
        auVar23._8_4_ = auVar68._8_4_;
        auVar23._12_4_ = auVar68._8_4_;
        auVar87 = auVar86 & auVar23 | auVar87;
        auVar64 = packssdw(auVar87,auVar87);
        auVar9._8_4_ = 0xffffffff;
        auVar9._0_8_ = 0xffffffffffffffff;
        auVar9._12_4_ = 0xffffffff;
        auVar64 = packssdw(auVar64 ^ auVar9,auVar64 ^ auVar9);
        auVar55 = packsswb(auVar55,auVar64);
        if ((auVar55._8_2_ >> 8 & 1) != 0) {
          pbVar42[-0x3c0] = false;
        }
        auVar55 = (auVar73 | auVar29) ^ auVar28;
        auVar70._0_4_ = -(uint)(iVar37 < auVar55._0_4_);
        auVar70._4_4_ = -(uint)(iVar36 < auVar55._4_4_);
        auVar70._8_4_ = -(uint)(iVar77 < auVar55._8_4_);
        auVar70._12_4_ = -(uint)(iVar78 < auVar55._12_4_);
        auVar88._4_4_ = auVar70._0_4_;
        auVar88._0_4_ = auVar70._0_4_;
        auVar88._8_4_ = auVar70._8_4_;
        auVar88._12_4_ = auVar70._8_4_;
        iVar92 = -(uint)(auVar55._4_4_ == iVar36);
        iVar96 = -(uint)(auVar55._12_4_ == iVar78);
        auVar24._4_4_ = iVar92;
        auVar24._0_4_ = iVar92;
        auVar24._8_4_ = iVar96;
        auVar24._12_4_ = iVar96;
        auVar95._4_4_ = auVar70._4_4_;
        auVar95._0_4_ = auVar70._4_4_;
        auVar95._8_4_ = auVar70._12_4_;
        auVar95._12_4_ = auVar70._12_4_;
        auVar55 = auVar24 & auVar88 | auVar95;
        auVar55 = packssdw(auVar55,auVar55);
        auVar10._8_4_ = 0xffffffff;
        auVar10._0_8_ = 0xffffffffffffffff;
        auVar10._12_4_ = 0xffffffff;
        auVar55 = packssdw(auVar55 ^ auVar10,auVar55 ^ auVar10);
        auVar55 = packsswb(auVar55,auVar55);
        if ((auVar55 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          pbVar42[-800] = false;
        }
        auVar55 = pshufhw(auVar55,auVar88,0x84);
        auVar25._4_4_ = iVar92;
        auVar25._0_4_ = iVar92;
        auVar25._8_4_ = iVar96;
        auVar25._12_4_ = iVar96;
        auVar75 = pshufhw(auVar70,auVar25,0x84);
        auVar64 = pshufhw(auVar55,auVar95,0x84);
        auVar60._8_4_ = 0xffffffff;
        auVar60._0_8_ = 0xffffffffffffffff;
        auVar60._12_4_ = 0xffffffff;
        auVar60 = (auVar64 | auVar75 & auVar55) ^ auVar60;
        auVar55 = packssdw(auVar60,auVar60);
        auVar55 = packsswb(auVar55,auVar55);
        if ((auVar55._10_2_ >> 8 & 1) != 0) {
          pbVar42[-0x280] = false;
        }
        auVar55 = (auVar73 | _DAT_001e9640) ^ auVar28;
        auVar71._0_4_ = -(uint)(iVar37 < auVar55._0_4_);
        auVar71._4_4_ = -(uint)(iVar36 < auVar55._4_4_);
        auVar71._8_4_ = -(uint)(iVar77 < auVar55._8_4_);
        auVar71._12_4_ = -(uint)(iVar78 < auVar55._12_4_);
        auVar26._4_4_ = auVar71._0_4_;
        auVar26._0_4_ = auVar71._0_4_;
        auVar26._8_4_ = auVar71._8_4_;
        auVar26._12_4_ = auVar71._8_4_;
        auVar75 = pshuflw(auVar95,auVar26,0xe8);
        auVar61._0_4_ = -(uint)(auVar55._0_4_ == iVar37);
        auVar61._4_4_ = -(uint)(auVar55._4_4_ == iVar36);
        auVar61._8_4_ = -(uint)(auVar55._8_4_ == iVar77);
        auVar61._12_4_ = -(uint)(auVar55._12_4_ == iVar78);
        auVar89._4_4_ = auVar61._4_4_;
        auVar89._0_4_ = auVar61._4_4_;
        auVar89._8_4_ = auVar61._12_4_;
        auVar89._12_4_ = auVar61._12_4_;
        auVar55 = pshuflw(auVar61,auVar89,0xe8);
        auVar90._4_4_ = auVar71._4_4_;
        auVar90._0_4_ = auVar71._4_4_;
        auVar90._8_4_ = auVar71._12_4_;
        auVar90._12_4_ = auVar71._12_4_;
        auVar64 = pshuflw(auVar71,auVar90,0xe8);
        auVar11._8_4_ = 0xffffffff;
        auVar11._0_8_ = 0xffffffffffffffff;
        auVar11._12_4_ = 0xffffffff;
        auVar55 = packssdw(auVar55 & auVar75,(auVar64 | auVar55 & auVar75) ^ auVar11);
        auVar55 = packsswb(auVar55,auVar55);
        if ((auVar55 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          pbVar42[-0x1e0] = false;
        }
        auVar27._4_4_ = auVar71._0_4_;
        auVar27._0_4_ = auVar71._0_4_;
        auVar27._8_4_ = auVar71._8_4_;
        auVar27._12_4_ = auVar71._8_4_;
        auVar90 = auVar89 & auVar27 | auVar90;
        auVar64 = packssdw(auVar90,auVar90);
        auVar12._8_4_ = 0xffffffff;
        auVar12._0_8_ = 0xffffffffffffffff;
        auVar12._12_4_ = 0xffffffff;
        auVar55 = packssdw(auVar55,auVar64 ^ auVar12);
        auVar55 = packsswb(auVar55,auVar55);
        if ((auVar55._12_2_ >> 8 & 1) != 0) {
          pbVar42[-0x140] = false;
        }
        auVar55 = (auVar73 | _DAT_001e9630) ^ auVar28;
        auVar62._0_4_ = -(uint)(iVar37 < auVar55._0_4_);
        auVar62._4_4_ = -(uint)(iVar36 < auVar55._4_4_);
        auVar62._8_4_ = -(uint)(iVar77 < auVar55._8_4_);
        auVar62._12_4_ = -(uint)(iVar78 < auVar55._12_4_);
        auVar91._4_4_ = auVar62._0_4_;
        auVar91._0_4_ = auVar62._0_4_;
        auVar91._8_4_ = auVar62._8_4_;
        auVar91._12_4_ = auVar62._8_4_;
        auVar74._4_4_ = -(uint)(auVar55._4_4_ == iVar36);
        auVar74._12_4_ = -(uint)(auVar55._12_4_ == iVar78);
        auVar74._0_4_ = auVar74._4_4_;
        auVar74._8_4_ = auVar74._12_4_;
        auVar76._4_4_ = auVar62._4_4_;
        auVar76._0_4_ = auVar62._4_4_;
        auVar76._8_4_ = auVar62._12_4_;
        auVar76._12_4_ = auVar62._12_4_;
        auVar64 = auVar74 & auVar91 | auVar76;
        auVar55 = packssdw(auVar62,auVar64);
        auVar13._8_4_ = 0xffffffff;
        auVar13._0_8_ = 0xffffffffffffffff;
        auVar13._12_4_ = 0xffffffff;
        auVar55 = packssdw(auVar55 ^ auVar13,auVar55 ^ auVar13);
        auVar55 = packsswb(auVar55,auVar55);
        if ((auVar55 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          pbVar42[-0xa0] = false;
        }
        auVar55 = pshufhw(auVar55,auVar91,0x84);
        auVar64 = pshufhw(auVar64,auVar74,0x84);
        auVar64 = auVar64 & auVar55;
        auVar55 = pshufhw(auVar55,auVar76,0x84);
        auVar63._8_4_ = 0xffffffff;
        auVar63._0_8_ = 0xffffffffffffffff;
        auVar63._12_4_ = 0xffffffff;
        auVar63 = (auVar55 | auVar64) ^ auVar63;
        auVar55 = packssdw(auVar63,auVar63);
        auVar55 = packsswb(auVar55,auVar55);
        if ((auVar55._14_2_ >> 8 & 1) != 0) {
          *pbVar42 = false;
        }
        uVar39 = uVar39 + 0x10;
        pbVar42 = pbVar42 + 0xa00;
      } while ((uVar38 / 0xa0 + 0x10 & 0xfffffffffffffff0) != uVar39);
    }
  }
  iVar37 = this->m_pinDiameter;
  iVar36 = (*this->m_board->_vptr_Board[4])();
  plVar47 = *(long **)CONCAT44(extraout_var,iVar36);
  plVar3 = (long *)((long *)CONCAT44(extraout_var,iVar36))[1];
  if (plVar47 == plVar3) {
LAB_00114df9:
    iVar37 = (*this->m_board->_vptr_Board[3])();
    uVar48 = (undefined4)((ulong)in_stack_fffffffffffffec8 >> 0x20);
    plVar3 = (long *)((undefined8 *)CONCAT44(extraout_var_00,iVar37))[1];
    fVar50 = (float)local_128;
    fVar72 = (float)local_118;
    for (plVar47 = *(long **)CONCAT44(extraout_var_00,iVar37); plVar47 != plVar3;
        plVar47 = plVar47 + 2) {
      lVar46 = *plVar47;
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar47[1];
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        }
      }
      if (lVar46 == 0) {
        bVar35 = true;
      }
      else {
        iVar37 = *(int *)(lVar46 + 8);
        bVar35 = iVar37 == 2 || iVar37 == this->m_current_side;
      }
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
        fVar50 = (float)local_128;
        fVar72 = (float)local_118;
      }
      if (bVar35) {
        lVar46 = *plVar47;
        local_d8._16_8_ = *(size_type *)(lVar46 + 0x80);
        aStack_c0._M_allocated_capacity = *(size_type *)(lVar46 + 0x88);
        uVar44 = aStack_c0._M_allocated_capacity;
        local_d8._0_4_ = ((ImVec2 *)(lVar46 + 0x70))->x;
        local_d8._4_4_ = ((ImVec2 *)(lVar46 + 0x70))->y;
        local_d8._8_8_ =
             *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               **)(lVar46 + 0x78);
        aStack_c0._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)(lVar46 + 0x88) >> 0x20);
        bVar35 = false;
        lVar46 = 0;
        lVar43 = 3;
        do {
          lVar40 = lVar46;
          fVar49 = *(float *)(local_d8 + lVar40 * 8 + 4);
          if ((fVar72 < fVar49 == (float)aStack_c0._M_allocated_capacity._4_4_ <= fVar72) &&
             (fVar50 < ((fVar72 - fVar49) *
                       (*(float *)(local_d8 + lVar43 * 8) - *(float *)(local_d8 + lVar40 * 8))) /
                       ((float)aStack_c0._M_allocated_capacity._4_4_ - fVar49) +
                       *(float *)(local_d8 + lVar40 * 8))) {
            bVar35 = !bVar35;
          }
          lVar46 = lVar40 + 1;
          lVar43 = lVar40;
          aStack_c0._M_allocated_capacity._4_4_ = fVar49;
        } while (lVar40 + 1 != 4);
        aStack_c0._M_allocated_capacity = uVar44;
        if (bVar35) {
          std::__cxx11::string::_M_assign((string *)&ContextMenu()::partn_abi_cxx11_);
          ImGui::SameLine(0.0,-1.0);
          fVar50 = (float)local_128;
          fVar72 = (float)local_118;
        }
      }
      uVar48 = (undefined4)((ulong)in_stack_fffffffffffffec8 >> 0x20);
    }
  }
  else {
    local_12c = (float)iVar37 * (float)iVar37;
    lVar46 = 0;
    fVar50 = (float)local_128;
    fVar72 = (float)local_118;
    do {
      lVar43 = *(long *)(*plVar47 + 0x68);
      p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*plVar47 + 0x70);
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        }
      }
      if (lVar43 == 0) {
        bVar35 = true;
      }
      else {
        iVar37 = *(int *)(lVar43 + 8);
        bVar35 = iVar37 == 2 || iVar37 == this->m_current_side;
      }
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
        fVar50 = (float)local_128;
        fVar72 = (float)local_118;
      }
      uVar48 = (undefined4)((ulong)in_stack_fffffffffffffec8 >> 0x20);
      if (bVar35) {
        lVar43 = *plVar47;
        fVar49 = *(float *)(lVar43 + 0x50) - fVar50;
        fVar54 = *(float *)(lVar43 + 0x54) - fVar72;
        fVar49 = fVar49 * fVar49 + fVar54 * fVar54;
        if (fVar49 < local_12c) {
          lVar46 = lVar43;
          local_12c = fVar49;
        }
      }
      plVar47 = plVar47 + 2;
    } while (plVar47 != plVar3);
    if (lVar46 == 0) goto LAB_00114df9;
    std::__cxx11::string::_M_assign((string *)&ContextMenu()::pin_abi_cxx11_);
    std::__cxx11::string::_M_assign((string *)&ContextMenu()::partn_abi_cxx11_);
    std::__cxx11::string::_M_assign((string *)&ContextMenu()::net_abi_cxx11_);
  }
  local_128 = (double)local_fc;
  local_118 = (double)local_100;
  iVar37 = this->m_annotation_clicked_id;
  if (-1 < (long)iVar37) {
    Annotation::Annotation
              ((Annotation *)local_d8,
               (this->m_annotations).annotations.
               super__Vector_base<Annotation,_std::allocator<Annotation>_>._M_impl.
               super__Vector_impl_data._M_start + iVar37);
    if (this->m_annotationedit_retain == false) {
      snprintf(ContextMenu::contextbuf,0x2800,"%s",local_d8._8_8_);
      this->m_annotationnew_retain = false;
      this->m_annotationedit_retain = true;
    }
    uVar44 = 0x42;
    if (this->m_current_side == 0) {
      uVar44 = 0x54;
    }
    if (local_88 == 0) {
      uVar45 = 0x20;
      uVar53 = 0x20;
    }
    else {
      uVar45 = 0x5b;
      if (local_68 == 0) {
        uVar45 = 0x20;
      }
      uVar53 = 0x5d;
      if (local_68 == 0) {
        uVar53 = 0x20;
      }
    }
    ImGui::Text("%c(%0.0f,%0.0f) %s, %s%c%s%c",local_128,local_118,uVar44,local_b0._M_p,
                local_90._M_p,uVar45,local_70._M_p,CONCAT44(uVar48,uVar53));
    iVar37 = DPI(600);
    fVar50 = ImGui::GetTextLineHeight();
    local_f8._4_4_ = fVar50 * 8.0;
    local_f8._0_4_ = (float)iVar37;
    uVar48 = 0;
    ImGui::InputTextMultiline
              ("##annotationedit",ContextMenu::contextbuf,0x2800,(ImVec2 *)local_f8,0,
               (ImGuiInputTextCallback)0x0,ContextMenu::contextbuf);
    local_38.x = 0.0;
    local_38.y = 0.0;
    bVar35 = ImGui::Button("Update##1",&local_38);
    if (bVar35) {
LAB_0011510b:
      this->m_annotationedit_retain = false;
      Annotations::Update(&this->m_annotations,
                          (this->m_annotations).annotations.
                          super__Vector_base<Annotation,_std::allocator<Annotation>_>._M_impl.
                          super__Vector_impl_data._M_start[this->m_annotation_clicked_id].id,
                          ContextMenu::contextbuf);
      Annotations::GenerateList(&this->m_annotations);
      this->m_needsRedraw = true;
      ImGui::CloseCurrentPopup();
    }
    else {
      local_f8._0_8_ = &local_e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"Validate","");
      bVar35 = KeyBindings::isPressed(&this->keybindings,(string *)local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._0_8_ != &local_e8) {
        operator_delete((void *)local_f8._0_8_,local_e8._M_allocated_capacity + 1);
      }
      if (bVar35) goto LAB_0011510b;
    }
    ImGui::SameLine(0.0,-1.0);
    local_f8._0_4_ = 0.0;
    local_f8._4_4_ = 0.0;
    bVar35 = ImGui::Button("Cancel##1",(ImVec2 *)local_f8);
    if (bVar35) {
      ImGui::CloseCurrentPopup();
      this->m_annotationnew_retain = false;
    }
    ImGui::Separator();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_p != local_60) {
      operator_delete(local_70._M_p,local_60[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_p != &local_80) {
      operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_p != &local_a0) {
      operator_delete(local_b0._M_p,local_a0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._8_8_ != &aStack_c0) {
      operator_delete((void *)local_d8._8_8_,aStack_c0._M_allocated_capacity + 1);
    }
    iVar37 = this->m_annotation_clicked_id;
  }
  if ((iVar37 < 0) && (this->m_annotationnew_retain == false)) {
    uVar44 = 0x42;
    if (this->m_current_side == 0) {
      uVar44 = 0x54;
    }
    uVar45 = 0x5b;
    if (ContextMenu()::pin_abi_cxx11_._M_string_length == 0 ||
        ContextMenu()::partn_abi_cxx11_._M_string_length == 0) {
      uVar45 = 0x20;
    }
    uVar53 = 0x5d;
    if (ContextMenu()::pin_abi_cxx11_._M_string_length == 0 ||
        ContextMenu()::partn_abi_cxx11_._M_string_length == 0) {
      uVar53 = 0x20;
    }
    uVar97 = CONCAT44(uVar48,uVar53);
    ImGui::Text("%c(%0.0f,%0.0f) %s %s%c%s%c",local_128,local_118,uVar44,
                ContextMenu()::net_abi_cxx11_._M_dataplus._M_p,
                ContextMenu()::partn_abi_cxx11_._M_dataplus._M_p,uVar45,
                ContextMenu()::pin_abi_cxx11_._M_dataplus._M_p,uVar97);
    uVar48 = (undefined4)((ulong)uVar97 >> 0x20);
    iVar37 = this->m_annotation_clicked_id;
  }
  if (iVar37 < 0) {
    bVar41 = this->m_annotationnew_retain;
LAB_001152ea:
    if (bVar41 == 0) {
      ContextMenu::contextbufnew[0] = '\0';
      this->m_annotationnew_retain = true;
      this->m_annotationedit_retain = false;
      this->m_annotation_clicked_id = -1;
    }
    uVar44 = 0x42;
    if (this->m_current_side == 0) {
      uVar44 = 0x54;
    }
    uVar45 = 0x5b;
    if (ContextMenu()::pin_abi_cxx11_._M_string_length == 0 ||
        ContextMenu()::partn_abi_cxx11_._M_string_length == 0) {
      uVar45 = 0x20;
    }
    uVar53 = 0x5d;
    if (ContextMenu()::pin_abi_cxx11_._M_string_length == 0 ||
        ContextMenu()::partn_abi_cxx11_._M_string_length == 0) {
      uVar53 = 0x20;
    }
    ImGui::Text("Create new annotation for: %c(%0.0f,%0.0f) %s %s%c%s%c",local_128,local_118,uVar44,
                ContextMenu()::net_abi_cxx11_._M_dataplus._M_p,
                ContextMenu()::partn_abi_cxx11_._M_dataplus._M_p,uVar45,
                ContextMenu()::pin_abi_cxx11_._M_dataplus._M_p,CONCAT44(uVar48,uVar53));
    ImGui::Spacing();
    iVar37 = DPI(600);
    local_12c = (float)iVar37;
    fVar50 = ImGui::GetTextLineHeight();
    local_d8._4_4_ = fVar50 * 8.0;
    local_d8._0_4_ = local_12c;
    ImGui::InputTextMultiline
              ("New##annotationnew",ContextMenu::contextbufnew,0x2800,(ImVec2 *)local_d8,0,
               (ImGuiInputTextCallback)0x0,ContextMenu::contextbufnew);
    local_f8._0_4_ = 0.0;
    local_f8._4_4_ = 0.0;
    bVar35 = ImGui::Button("Apply##1",(ImVec2 *)local_f8);
    if (!bVar35) {
      local_d8._0_8_ = (long)local_d8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"Validate","");
      bVar35 = KeyBindings::isPressed(&this->keybindings,(string *)local_d8);
      if (local_d8._0_8_ != (long)local_d8 + 0x10) {
        operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
      }
      if (!bVar35) goto LAB_001154af;
    }
    this->m_annotationnew_retain = false;
    if (this->debug == true) {
      ContextMenu();
    }
    Annotations::Add(&this->m_annotations,this->m_current_side,local_128,local_118,
                     ContextMenu()::net_abi_cxx11_._M_dataplus._M_p,
                     ContextMenu()::partn_abi_cxx11_._M_dataplus._M_p,
                     ContextMenu()::pin_abi_cxx11_._M_dataplus._M_p,ContextMenu::contextbufnew);
    Annotations::GenerateList(&this->m_annotations);
    this->m_needsRedraw = true;
    ImGui::CloseCurrentPopup();
  }
  else {
    local_d8._0_4_ = 0.0;
    local_d8._4_4_ = 0.0;
    bVar35 = ImGui::Button("Add New##1",(ImVec2 *)local_d8);
    bVar41 = this->m_annotationnew_retain;
    if ((bVar35) || ((bVar41 & 1) != 0)) goto LAB_001152ea;
    ImGui::SameLine(0.0,-1.0);
  }
LAB_001154af:
  if (-1 < this->m_annotation_clicked_id) {
    local_d8._0_4_ = 0.0;
    local_d8._4_4_ = 0.0;
    bVar35 = ImGui::Button("Remove",(ImVec2 *)local_d8);
    if (bVar35) {
      Annotations::Remove(&this->m_annotations,
                          (this->m_annotations).annotations.
                          super__Vector_base<Annotation,_std::allocator<Annotation>_>._M_impl.
                          super__Vector_impl_data._M_start[this->m_annotation_clicked_id].id);
      Annotations::GenerateList(&this->m_annotations);
      this->m_needsRedraw = true;
      ImGui::CloseCurrentPopup();
    }
  }
  ImGui::SameLine(0.0,-1.0);
  local_f8._0_4_ = 0.0;
  local_f8._4_4_ = 0.0;
  bVar35 = ImGui::Button("Cancel##2",(ImVec2 *)local_f8);
  if (bVar35) {
LAB_0011558c:
    this->m_annotationnew_retain = false;
    this->m_annotationedit_retain = false;
    ImGui::CloseCurrentPopup();
  }
  else {
    local_d8._0_8_ = (long)local_d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"CloseDialog","");
    bVar35 = KeyBindings::isPressed(&this->keybindings,(string *)local_d8);
    if (local_d8._0_8_ != (long)local_d8 + 0x10) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
    }
    if (bVar35) goto LAB_0011558c;
  }
  ImGui::EndPopup();
LAB_0011559f:
  ImGui::PopStyleVar(1);
  if (local_12d == false) {
    this->m_annotationnew_retain = false;
    this->m_annotationedit_retain = false;
  }
  return;
}

Assistant:

void BoardView::ContextMenu(void) {
	bool dummy                       = true;
	static char contextbuf[10240]    = "";
	static char contextbufnew[10240] = "";
	static std::string pin, partn, net;
	double tx, ty;

	ImVec2 pos = ScreenToCoord(m_showContextMenuPos.x, m_showContextMenuPos.y);

	/*
	 * So we don't have dozens of near-same-spot annotation points, we truncate
	 * back to integer levels, which still gives us 1-thou precision
	 */
	tx = trunc(pos.x);
	ty = trunc(pos.y);

	/*
	 * Originally the dialog was to follow the cursor but it proved to be an overkill
	 * to try adjust things to keep it within the bounds of the window so as to not
	 * lose the buttons.
	 *
	 * Now it's kept at a fixed point.
	 */
	ImGui::SetNextWindowPos(ImVec2(DPIF(50), DPIF(50)));
	ImGui::PushStyleVar(ImGuiStyleVar_WindowBorderSize, 1.0f);
	if (ImGui::BeginPopupModal("Annotations", &dummy, ImGuiWindowFlags_AlwaysAutoResize)) {

		if (m_showContextMenu) {
			contextbuf[0]      = 0;
			m_showContextMenu  = false;
			for (auto &ann : m_annotations.annotations) ann.hovered = false;
		}

		/*
		 * For the new annotation possibility, we need to detect our various
		 * attributes that we can bind to, such as pin, net, part
		 */
		{
			/*
			 * we're going to go through all the possible items we can annotate at this position and offer them
			 */

			float min_dist = m_pinDiameter * 1.0f;

			/*
			 * find the closest pin, starting at no more than
			 * 1 radius away
			 */
			min_dist *= min_dist; // all distance squared
			Pin *selection = nullptr;
			for (auto &pin : m_board->Pins()) {
				if (BoardElementIsVisible(pin->component)) {
					float dx   = pin->position.x - pos.x;
					float dy   = pin->position.y - pos.y;
					float dist = dx * dx + dy * dy;
					if (dist < min_dist) {
						selection = pin.get();
						min_dist  = dist;
					}
				}
			}

			/*
			 * If there was a pin selected, we can extract net/part off it
			 */

			if (selection != nullptr) {
				pin   = selection->name;
				partn = selection->component->name;
				net   = selection->net->name;
			} else {

				/*
				 * ELSE if we didn't get a pin selected, we can still
				 * check for a part.
				 *
				 * There is a problem where we can be on two parts
				 * but haven't decided what to do in such a situation
				 */

				for (auto &part : m_board->Components()) {
					int hit = 0;
					//					auto p_part = part.get();

					if (!BoardElementIsVisible(part)) continue;

					// Work out if the point is inside the hull
					{
						auto poly = part->outline;

						for (size_t i = 0, j = poly.size() - 1; i < poly.size(); j = i++) {
							if (((poly[i].y > pos.y) != (poly[j].y > pos.y)) &&
							    (pos.x < (poly[j].x - poly[i].x) * (pos.y - poly[i].y) / (poly[j].y - poly[i].y) + poly[i].x))
								hit = !hit;
						}
					} // hull test
					if (hit) {
						partn = part->name;

						ImGui::SameLine();
					}

				} // for each part
			}

			{

				/*
				 * For existing annotations
				 */
				if (m_annotation_clicked_id >= 0) {
					if (m_annotationedit_retain || (m_annotation_clicked_id >= 0)) {
						Annotation ann = m_annotations.annotations[m_annotation_clicked_id];
						if (!m_annotationedit_retain) {
							snprintf(contextbuf, sizeof(contextbuf), "%s", ann.note.c_str());
							m_annotationedit_retain = true;
							m_annotationnew_retain  = false;
						}

						ImGui::Text("%c(%0.0f,%0.0f) %s, %s%c%s%c",
						            m_current_side ? 'B' : 'T',
						            tx,
						            ty,
						            ann.net.c_str(),
						            ann.part.c_str(),
						            ann.part.size() && ann.pin.size() ? '[' : ' ',
						            ann.pin.c_str(),
						            ann.part.size() && ann.pin.size() ? ']' : ' ');
						ImGui::InputTextMultiline("##annotationedit",
						                          contextbuf,
						                          sizeof(contextbuf),
						                          ImVec2(DPI(600), ImGui::GetTextLineHeight() * 8),
						                          0,
						                          NULL,
						                          contextbuf);

						if (ImGui::Button("Update##1") || keybindings.isPressed("Validate")) {
							m_annotationedit_retain = false;
							m_annotations.Update(m_annotations.annotations[m_annotation_clicked_id].id, contextbuf);
							m_annotations.GenerateList();
							m_needsRedraw      = true;
							ImGui::CloseCurrentPopup();
						}
						ImGui::SameLine();
						if (ImGui::Button("Cancel##1")) {
							ImGui::CloseCurrentPopup();
							m_annotationnew_retain = false;
						}
						ImGui::Separator();
					}
				}

				/*
				 * For generating a new annotation
				 */
				if ((m_annotation_clicked_id < 0) && (m_annotationnew_retain == false)) {
					ImGui::Text("%c(%0.0f,%0.0f) %s %s%c%s%c",
					            m_current_side ? 'B' : 'T',
					            tx,
					            ty,
					            net.c_str(),
					            partn.c_str(),
					            partn.empty() || pin.empty() ? ' ' : '[',
					            pin.c_str(),
					            partn.empty() || pin.empty() ? ' ' : ']');
				}
				if ((m_annotation_clicked_id < 0) || ImGui::Button("Add New##1") || m_annotationnew_retain) {
					if (m_annotationnew_retain == false) {
						contextbufnew[0]        = 0;
						m_annotationnew_retain  = true;
						m_annotation_clicked_id = -1;
						m_annotationedit_retain = false;
					}

					ImGui::Text("Create new annotation for: %c(%0.0f,%0.0f) %s %s%c%s%c",
					            m_current_side ? 'B' : 'T',
					            tx,
					            ty,
					            net.c_str(),
					            partn.c_str(),
					            partn.empty() || pin.empty() ? ' ' : '[',
					            pin.c_str(),
					            partn.empty() || pin.empty() ? ' ' : ']');
					ImGui::Spacing();
					ImGui::InputTextMultiline("New##annotationnew",
					                          contextbufnew,
					                          sizeof(contextbufnew),
					                          ImVec2(DPI(600), ImGui::GetTextLineHeight() * 8),
					                          0,
					                          NULL,
					                          contextbufnew);

					if (ImGui::Button("Apply##1") || keybindings.isPressed("Validate")) {
						m_annotationnew_retain = false;
						if (debug) fprintf(stderr, "DATA:'%s'\n\n", contextbufnew);

						m_annotations.Add(m_current_side, tx, ty, net.c_str(), partn.c_str(), pin.c_str(), contextbufnew);
						m_annotations.GenerateList();
						m_needsRedraw = true;

						ImGui::CloseCurrentPopup();
					}
					/*
					ImGui::SameLine();
					if (ImGui::Button("Cancel")) {
					    ImGui::CloseCurrentPopup();
					    m_annotationnew_retain = false;
					}
					*/
				} else {
					ImGui::SameLine();
				}

				if ((m_annotation_clicked_id >= 0) && (ImGui::Button("Remove"))) {
					m_annotations.Remove(m_annotations.annotations[m_annotation_clicked_id].id);
					m_annotations.GenerateList();
					m_needsRedraw = true;
					ImGui::CloseCurrentPopup();
				}
			}

			// the position.
		}

		ImGui::SameLine();
		if (ImGui::Button("Cancel##2") || keybindings.isPressed("CloseDialog")) {
			m_annotationnew_retain  = false;
			m_annotationedit_retain = false;
			ImGui::CloseCurrentPopup();
		}
		ImGui::EndPopup();
	}
	ImGui::PopStyleVar();

	/** if the dialog was closed by using the (X) icon **/
	if (!dummy) {
		m_annotationnew_retain  = false;
		m_annotationedit_retain = false;
	}
}